

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

int zlib_freetable(zlib_table **ztab)

{
  zlib_table *ptr;
  int in_EAX;
  int iVar1;
  int extraout_EAX;
  long lVar2;
  long lVar3;
  
  if ((ztab != (zlib_table **)0x0) && (ptr = *ztab, ptr != (zlib_table *)0x0)) {
    iVar1 = ptr->mask;
    if (-1 < iVar1) {
      lVar3 = -1;
      lVar2 = 8;
      do {
        if (*(long *)(&ptr->table->nbits + lVar2) != 0) {
          zlib_freetable((zlib_table **)(&ptr->table->nbits + lVar2));
          iVar1 = ptr->mask;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < iVar1);
    }
    safefree(ptr->table);
    ptr->table = (zlib_tableentry *)0x0;
    safefree(ptr);
    *ztab = (zlib_table *)0x0;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int zlib_freetable(struct zlib_table **ztab)
{
    struct zlib_table *tab;
    int code;

    if (ztab == NULL)
        return -1;

    if (*ztab == NULL)
        return 0;

    tab = *ztab;

    for (code = 0; code <= tab->mask; code++)
        if (tab->table[code].nexttable != NULL)
            zlib_freetable(&tab->table[code].nexttable);

    sfree(tab->table);
    tab->table = NULL;

    sfree(tab);
    *ztab = NULL;

    return (0);
}